

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O1

void nni_panic(char *fmt,...)

{
  char local_1b8 [8];
  char buf [100];
  char local_148 [8];
  char fbuf [93];
  undefined8 local_38;
  va_list va;
  
  va[0].overflow_arg_area = fbuf + 0x58;
  va[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000008;
  vsnprintf(local_148,0x5d,fmt,&local_38);
  snprintf(local_1b8,100,"panic: %s",local_148);
  nni_plat_printf("%s\n",local_1b8);
  nni_plat_printf("%s\n","This message is indicative of a BUG.");
  nni_plat_printf("%s\n","Report this at https://github.com/nanomsg/nng/issues");
  nni_show_backtrace();
  nni_plat_abort();
  return;
}

Assistant:

void
nni_panic(const char *fmt, ...)
{
	char    buf[100];
	char    fbuf[93]; // 7 bytes of "panic: "
	va_list va;

	va_start(va, fmt);
	(void) vsnprintf(fbuf, sizeof(fbuf), fmt, va);
	va_end(va);

	(void) snprintf(buf, sizeof(buf), "panic: %s", fbuf);

	nni_println(buf);
	nni_println("This message is indicative of a BUG.");
	nni_println("Report this at https://github.com/nanomsg/nng/issues");

	nni_show_backtrace();
	nni_plat_abort();
}